

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

void replace_helper(QString *str,QSpan<unsigned_long,_18446744073709551615UL> indices,qsizetype blen
                   ,QStringView after)

{
  Data *pDVar1;
  char16_t *pcVar2;
  QArrayData *data;
  QVLAStorage<2UL,_2UL,_256LL> *pQVar3;
  QStringView after_00;
  char16_t *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  value_type *__value;
  size_t sVar10;
  char16_t *__dest;
  long in_FS_OFFSET;
  longlong __n2;
  back_insert_iterator<QVarLengthArray<QChar,_256LL>_> local_260;
  QVarLengthArray<QChar,_256LL> local_258;
  long local_38;
  
  __value = (value_type *)after.m_data;
  lVar8 = after.m_size;
  lVar5 = indices.super_QSpanBase<unsigned_long,_18446744073709551615UL>.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (str->d).d;
  lVar7 = (str->d).size;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0032d4cb:
    pcVar4 = (str->d).ptr;
    local_258.super_QVLABase<QChar>.super_QVLABaseBase.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_258.super_QVLABase<QChar>.super_QVLABaseBase.a = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_258.super_QVLABase<QChar>.super_QVLABaseBase.s = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)&local_258,lVar7 + (lVar8 - blen) * lVar5,Uninitialized);
    __dest = (char16_t *)local_258.super_QVLABase<QChar>.super_QVLABaseBase.s;
    if (lVar5 != 0) {
      lVar7 = 0;
      do {
        lVar6 = *(long *)((long)indices.super_QSpanBase<unsigned_long,_18446744073709551615UL>.
                                m_data + lVar7);
        pcVar2 = (str->d).ptr;
        sVar10 = (long)pcVar2 + (lVar6 * 2 - (long)pcVar4);
        if (sVar10 != 0) {
          memmove(__dest,pcVar4,sVar10);
        }
        __dest = (char16_t *)((long)__dest + sVar10);
        if (0 < lVar8) {
          memmove(__dest,__value,lVar8 * 2);
          __dest = __dest + lVar8;
        }
        pcVar4 = pcVar2 + lVar6 + blen;
        lVar7 = lVar7 + 8;
      } while (lVar5 << 3 != lVar7);
    }
    sVar10 = (long)(str->d).ptr + ((str->d).size * 2 - (long)pcVar4);
    if (sVar10 != 0) {
      memmove(__dest,pcVar4,sVar10);
    }
    data = &((str->d).d)->super_QArrayData;
    pcVar4 = (str->d).ptr;
    (str->d).d = (Data *)local_258.super_QVLABase<QChar>.super_QVLABaseBase.a;
    (str->d).ptr = (char16_t *)local_258.super_QVLABase<QChar>.super_QVLABaseBase.s;
    pQVar3 = (QVLAStorage<2UL,_2UL,_256LL> *)(str->d).size;
    (str->d).size = (qsizetype)local_258.super_QVLABase<QChar>.super_QVLABaseBase.ptr;
    local_258.super_QVLABase<QChar>.super_QVLABaseBase.a = (qsizetype)data;
    local_258.super_QVLABase<QChar>.super_QVLABaseBase.s = (qsizetype)pcVar4;
    local_258.super_QVLABase<QChar>.super_QVLABaseBase.ptr = pQVar3;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  else {
    if (pDVar1 == (Data *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar6 = (pDVar1->super_QArrayData).alloc;
    }
    if (pDVar1 == (Data *)0x0) {
      lVar9 = 0;
    }
    else {
      lVar9 = (long)((long)(str->d).ptr -
                    ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
              1;
    }
    if (lVar6 - lVar9 < (lVar8 - blen) * lVar5 + lVar7) goto LAB_0032d4cb;
    pcVar4 = (str->d).ptr;
    if ((value_type *)pcVar4 == (value_type *)0x0) {
      pcVar4 = L"";
    }
    if ((value_type *)pcVar4 + lVar7 <= __value || __value < pcVar4) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        replace_in_place(str,indices,blen,after);
        return;
      }
      goto LAB_0032d795;
    }
    pQVar3 = &local_258.super_QVLAStorage<2UL,_2UL,_256LL>;
    local_258.super_QVLABase<QChar>.super_QVLABaseBase.a = 0x100;
    local_258.super_QVLABase<QChar>.super_QVLABaseBase.s = 0;
    local_258.super_QVLABase<QChar>.super_QVLABaseBase.ptr = pQVar3;
    if (0x100 < lVar8) {
      QVLABase<QChar>::reallocate_impl(&local_258.super_QVLABase<QChar>,0x100,pQVar3,0,lVar8);
    }
    local_260.container = &local_258;
    if (0 < lVar8) {
      lVar8 = lVar8 + 1;
      do {
        std::back_insert_iterator<QVarLengthArray<QChar,_256LL>_>::operator=(&local_260,__value);
        __value = __value + 1;
        lVar8 = lVar8 + -1;
      } while (1 < lVar8);
    }
    after_00.m_data =
         (storage_type_conflict *)local_258.super_QVLABase<QChar>.super_QVLABaseBase.ptr;
    after_00.m_size = local_258.super_QVLABase<QChar>.super_QVLABaseBase.s;
    replace_in_place(str,indices,blen,after_00);
    if ((QVLAStorage<2UL,_2UL,_256LL> *)local_258.super_QVLABase<QChar>.super_QVLABaseBase.ptr !=
        pQVar3) {
      QtPrivate::sizedFree
                (local_258.super_QVLABase<QChar>.super_QVLABaseBase.ptr,
                 local_258.super_QVLABase<QChar>.super_QVLABaseBase.a * 2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0032d795:
  __stack_chk_fail();
}

Assistant:

static void replace_helper(QString &str, QSpan<size_t> indices, qsizetype blen, QStringView after)
{
    const qsizetype oldSize = str.data_ptr().size;
    const qsizetype adjust = indices.size() * (after.size() - blen);
    const qsizetype newSize = oldSize + adjust;
    if (str.data_ptr().needsDetach() || needsReallocate(str, newSize)) {
        replace_with_copy(str, indices, blen, after);
        return;
    }

    if (QtPrivate::q_points_into_range(after.begin(), str))
        // Copy after if it lies inside our own d.b area (which we could
        // possibly invalidate via a realloc or modify by replacement)
        replace_in_place(str, indices, blen, QVarLengthArray(after.begin(), after.end()));
    else
        replace_in_place(str, indices, blen, after);
}